

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_biquad_init(ma_biquad_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                        ma_biquad *pBQ)

{
  bool bVar1;
  ma_result mVar2;
  size_t __size;
  void *pHeap;
  size_t sVar3;
  
  mVar2 = MA_INVALID_ARGS;
  __size = 0;
  if ((pConfig == (ma_biquad_config *)0x0) || ((ulong)pConfig->channels == 0)) {
    sVar3 = 0;
    bVar1 = false;
  }
  else {
    sVar3 = (ulong)pConfig->channels << 3;
    bVar1 = true;
    mVar2 = MA_SUCCESS;
  }
  if (bVar1) {
    mVar2 = MA_SUCCESS;
    __size = sVar3;
  }
  if (mVar2 == MA_SUCCESS) {
    if (__size == 0) {
      pHeap = (void *)0x0;
    }
    else {
      if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
        pHeap = malloc(__size);
      }
      else if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
        pHeap = (void *)0x0;
      }
      else {
        pHeap = (*pAllocationCallbacks->onMalloc)(__size,pAllocationCallbacks->pUserData);
      }
      if (pHeap == (void *)0x0) {
        return MA_OUT_OF_MEMORY;
      }
    }
    mVar2 = ma_biquad_init_preallocated(pConfig,pHeap,pBQ);
    if (mVar2 == MA_SUCCESS) {
      pBQ->_ownsHeap = 1;
      mVar2 = MA_SUCCESS;
    }
    else {
      ma_free(pHeap,pAllocationCallbacks);
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_biquad_init(const ma_biquad_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_biquad* pBQ)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_biquad_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_biquad_init_preallocated(pConfig, pHeap, pBQ);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pBQ->_ownsHeap = MA_TRUE;
    return MA_SUCCESS;
}